

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_>::Resize
          (TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_> *this,hash_t nhsize)

{
  Node *block;
  Node *pNVar1;
  ulong uVar2;
  IPair *other;
  bool bVar3;
  FString FStack_38;
  
  uVar2 = (ulong)this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  pNVar1 = block;
  while (other = &pNVar1->Pair, bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    if (*(long *)((long)(other + -1) + 8) != 1) {
      FString::AttachToOther(&FStack_38,&other->Key);
      pNVar1 = NewKey(this,&FStack_38);
      FString::~FString(&FStack_38);
      (pNVar1->Pair).Value = other->Value;
      FString::~FString(&other->Key);
    }
    pNVar1 = (Node *)(other + 1);
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}